

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * unpack22_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3fffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x16;
  out[1] = (uVar1 >> 0x16) + base + (in[1] & 0xfff) * 0x400;
  uVar1 = in[1];
  out[2] = uVar1 >> 0xc;
  out[2] = (uVar1 >> 0xc) + base + (in[2] & 3) * 0x100000;
  out[3] = (in[2] >> 2 & 0x3fffff) + base;
  uVar1 = in[2];
  out[4] = uVar1 >> 0x18;
  out[4] = (uVar1 >> 0x18) + base + (in[3] & 0x3fff) * 0x100;
  uVar1 = in[3];
  out[5] = uVar1 >> 0xe;
  out[5] = (uVar1 >> 0xe) + base + (in[4] & 0xf) * 0x40000;
  out[6] = (in[4] >> 4 & 0x3fffff) + base;
  uVar1 = in[4];
  out[7] = uVar1 >> 0x1a;
  out[7] = (uVar1 >> 0x1a) + base + (in[5] & 0xffff) * 0x40;
  uVar1 = in[5];
  out[8] = uVar1 >> 0x10;
  out[8] = (uVar1 >> 0x10) + base + (in[6] & 0x3f) * 0x10000;
  out[9] = (in[6] >> 6 & 0x3fffff) + base;
  uVar1 = in[6];
  out[10] = uVar1 >> 0x1c;
  out[10] = (uVar1 >> 0x1c) + base + (in[7] & 0x3ffff) * 0x10;
  uVar1 = in[7];
  out[0xb] = uVar1 >> 0x12;
  out[0xb] = (uVar1 >> 0x12) + base + (in[8] & 0xff) * 0x4000;
  out[0xc] = (in[8] >> 8 & 0x3fffff) + base;
  uVar1 = in[8];
  out[0xd] = uVar1 >> 0x1e;
  out[0xd] = (uVar1 >> 0x1e) + base + (in[9] & 0xfffff) * 4;
  uVar1 = in[9];
  out[0xe] = uVar1 >> 0x14;
  out[0xe] = (uVar1 >> 0x14) + base + (in[10] & 0x3ff) * 0x1000;
  out[0xf] = (in[10] >> 10) + base;
  out[0x10] = (in[0xb] & 0x3fffff) + base;
  uVar1 = in[0xb];
  out[0x11] = uVar1 >> 0x16;
  out[0x11] = (uVar1 >> 0x16) + base + (in[0xc] & 0xfff) * 0x400;
  uVar1 = in[0xc];
  out[0x12] = uVar1 >> 0xc;
  out[0x12] = (uVar1 >> 0xc) + base + (in[0xd] & 3) * 0x100000;
  out[0x13] = (in[0xd] >> 2 & 0x3fffff) + base;
  uVar1 = in[0xd];
  out[0x14] = uVar1 >> 0x18;
  out[0x14] = (uVar1 >> 0x18) + base + (in[0xe] & 0x3fff) * 0x100;
  uVar1 = in[0xe];
  out[0x15] = uVar1 >> 0xe;
  out[0x15] = (uVar1 >> 0xe) + base + (in[0xf] & 0xf) * 0x40000;
  out[0x16] = (in[0xf] >> 4 & 0x3fffff) + base;
  uVar1 = in[0xf];
  out[0x17] = uVar1 >> 0x1a;
  out[0x17] = (uVar1 >> 0x1a) + base + (in[0x10] & 0xffff) * 0x40;
  uVar1 = in[0x10];
  out[0x18] = uVar1 >> 0x10;
  out[0x18] = (uVar1 >> 0x10) + base + (in[0x11] & 0x3f) * 0x10000;
  out[0x19] = (in[0x11] >> 6 & 0x3fffff) + base;
  uVar1 = in[0x11];
  out[0x1a] = uVar1 >> 0x1c;
  out[0x1a] = (uVar1 >> 0x1c) + base + (in[0x12] & 0x3ffff) * 0x10;
  uVar1 = in[0x12];
  out[0x1b] = uVar1 >> 0x12;
  out[0x1b] = (uVar1 >> 0x12) + base + (in[0x13] & 0xff) * 0x4000;
  out[0x1c] = (in[0x13] >> 8 & 0x3fffff) + base;
  uVar1 = in[0x13];
  out[0x1d] = uVar1 >> 0x1e;
  out[0x1d] = (uVar1 >> 0x1e) + base + (in[0x14] & 0xfffff) * 4;
  uVar1 = in[0x14];
  out[0x1e] = uVar1 >> 0x14;
  out[0x1e] = (uVar1 >> 0x14) + base + (in[0x15] & 0x3ff) * 0x1000;
  out[0x1f] = (in[0x15] >> 10) + base;
  return in + 0x16;
}

Assistant:

uint32_t * unpack22_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 22 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 22 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 22 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 22 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 22 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 22 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 22 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 22 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 22 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 22 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 22 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 22 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 22 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 22 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 22 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 22 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 22 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 22 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 22 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 22 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}